

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O2

int Abc_NtkGetMultiRefNum(Abc_Ntk_t *pNtk)

{
  Abc_Obj_t *pAVar1;
  int iVar2;
  int i;
  
  if (pNtk->ntkType == ABC_NTK_STRASH) {
    iVar2 = 0;
    for (i = 0; i < pNtk->vObjs->nSize; i = i + 1) {
      pAVar1 = Abc_NtkObj(pNtk,i);
      if ((pAVar1 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar1->field_0x14 & 0xf) == 7)) {
        iVar2 = iVar2 + (uint)(1 < (pAVar1->vFanouts).nSize);
      }
    }
    return iVar2;
  }
  __assert_fail("Abc_NtkIsStrash(pNtk)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcUtil.c"
                ,0xe3,"int Abc_NtkGetMultiRefNum(Abc_Ntk_t *)");
}

Assistant:

int Abc_NtkGetMultiRefNum( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pNode;
    int nNodes, i;
    assert( Abc_NtkIsStrash(pNtk) );
    nNodes = 0;
    Abc_NtkForEachNode( pNtk, pNode, i )
        nNodes += (int)(Abc_ObjFanoutNum(pNode) > 1);
    return nNodes;
}